

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.cpp
# Opt level: O3

void __thiscall mjs::gc_heap::gc_heap(gc_heap *this,void *storage,uint32_t capacity)

{
  gc_heap_ptr_untyped **ppgVar1;
  
  ppgVar1 = pointer_set::alloc(10);
  (this->pointers_).set_ = ppgVar1;
  (this->pointers_).capacity_ = 10;
  (this->pointers_).size_ = 0;
  (this->alloc_context_).storage_ = (slot *)storage;
  (this->alloc_context_).capacity_ = capacity >> 1;
  (this->alloc_context_).start_ = 0;
  (this->alloc_context_).next_free_ = 0;
  if (1 < capacity) {
    this->owns_storage_ = false;
    (this->gc_state_).level = 0;
    (this->gc_state_).new_context = (allocation_context *)0x0;
    (this->gc_state_).pending_fixups.
    super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->gc_state_).pending_fixups.
    super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->gc_state_).pending_fixups.
    super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->gc_state_).weak_fixups.
    super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->gc_state_).weak_fixups.
    super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->gc_state_).weak_fixups.
    super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return;
  }
  __assert_fail("start < capacity",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                0x149,
                "mjs::gc_heap::allocation_context::allocation_context(slot *, uint32_t, uint32_t)");
}

Assistant:

gc_heap::gc_heap(void* storage, uint32_t capacity) : alloc_context_(storage, capacity), owns_storage_(false) {
}